

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool tidyFileExists(TidyDoc tdoc,ctmbstr filename)

{
  int iVar1;
  ctmbstr __name;
  
  __name = ExpandTilde((TidyDocImpl *)tdoc,filename);
  iVar1 = access(__name,0);
  if (__name != filename) {
    (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))(*(long **)(tdoc + 0xd20),__name);
  }
  return (Bool)(iVar1 == 0);
}

Assistant:

Bool TIDY_CALL tidyFileExists( TidyDoc tdoc, ctmbstr filename )
{
  TidyDocImpl* doc = tidyDocToImpl( tdoc );
  ctmbstr fname = (tmbstr) ExpandTilde( doc, filename );
#ifndef NO_ACCESS_SUPPORT
  Bool exists = ( access(fname, 0) == 0 );
#else
  Bool exists;
  /* at present */
  FILE* fin = fopen(fname, "r");
  if (fin != NULL)
      fclose(fin);
  exists = ( fin != NULL );
#endif
  if ( fname != filename )
      TidyDocFree( doc, (tmbstr) fname );
  return exists;
}